

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::StandardColumnWriter<unsigned_short,_int,_duckdb::ParquetCastOperator>::Analyze
          (StandardColumnWriter<unsigned_short,_int,_duckdb::ParquetCastOperator> *this,
          ColumnWriterState *state_p,ColumnWriterState *parent,Vector *vector,idx_t count)

{
  bool bVar1;
  byte bVar2;
  StandardColumnWriterState<unsigned_short,_int,_duckdb::ParquetCastOperator> *pSVar3;
  unsigned_short *puVar4;
  size_type sVar5;
  ValidityMask *this_00;
  idx_t iVar6;
  long in_RDX;
  TemplatedValidityMask<unsigned_long> *in_R8;
  unsigned_short *src_value_1;
  idx_t i;
  unsigned_short *src_value;
  ValidityMask *validity;
  idx_t vcount;
  idx_t parent_index;
  bool check_parent_empty;
  idx_t vector_index;
  unsigned_short *data_ptr;
  StandardColumnWriterState<unsigned_short,_int,_duckdb::ParquetCastOperator> *state;
  uint7 in_stack_ffffffffffffff58;
  ColumnWriterState *in_stack_ffffffffffffff60;
  TemplatedValidityMask<unsigned_long> *this_01;
  undefined7 in_stack_ffffffffffffff70;
  byte bVar7;
  reference local_80;
  TemplatedValidityMask<unsigned_long> *local_70;
  unsigned_short *local_68;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffa0;
  TemplatedValidityMask<unsigned_long> *local_40;
  
  pSVar3 = ColumnWriterState::
           Cast<duckdb::StandardColumnWriterState<unsigned_short,int,duckdb::ParquetCastOperator>>
                     (in_stack_ffffffffffffff60);
  puVar4 = FlatVector::GetData<unsigned_short>((Vector *)0x5ec2fe);
  local_40 = (TemplatedValidityMask<unsigned_long> *)0x0;
  bVar7 = 0;
  if (in_RDX != 0) {
    bVar1 = std::vector<bool,_std::allocator<bool>_>::empty(in_stack_ffffffffffffffa0);
    bVar7 = bVar1 ^ 0xff;
  }
  bVar2 = bVar7 & 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
            (&(pSVar3->super_PrimitiveColumnWriterState).super_ColumnWriterState.definition_levels.
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>);
  if (bVar2 != 0) {
    in_stack_ffffffffffffff60 =
         (ColumnWriterState *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDX + 8));
    sVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                      (&(pSVar3->super_PrimitiveColumnWriterState).super_ColumnWriterState.
                        definition_levels.
                        super_vector<unsigned_short,_std::allocator<unsigned_short>_>);
    in_R8 = (TemplatedValidityMask<unsigned_long> *)((long)in_stack_ffffffffffffff60 - sVar5);
  }
  this_01 = in_R8;
  this_00 = FlatVector::Validity((Vector *)0x5ec3b2);
  if ((bVar2 == 0) &&
     (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                        ((TemplatedValidityMask<unsigned_long> *)this_00), bVar1)) {
    for (; local_40 < in_R8; local_40 = local_40 + 1) {
      local_68 = puVar4 + (long)local_40;
      PrimitiveDictionary<unsigned_short,_int,_duckdb::ParquetCastOperator>::Insert
                ((PrimitiveDictionary<unsigned_short,_int,_duckdb::ParquetCastOperator> *)
                 CONCAT17(bVar7,in_stack_ffffffffffffff70),(unsigned_short)((ulong)this_01 >> 0x30))
      ;
      pSVar3->total_value_count = pSVar3->total_value_count + 1;
      iVar6 = DlbaEncoder::GetStringSize<unsigned_short>(local_68);
      pSVar3->total_string_size = iVar6 + pSVar3->total_string_size;
    }
  }
  else {
    for (local_70 = (TemplatedValidityMask<unsigned_long> *)0x0; local_70 < in_R8;
        local_70 = local_70 + 1) {
      bVar1 = false;
      if (bVar2 != 0) {
        local_80 = vector<bool,_true>::operator[]
                             ((vector<bool,_true> *)in_stack_ffffffffffffff60,
                              (ulong)in_stack_ffffffffffffff58);
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_80);
      }
      if (bVar1 == false) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (this_01,(idx_t)in_stack_ffffffffffffff60);
        if (bVar1) {
          PrimitiveDictionary<unsigned_short,_int,_duckdb::ParquetCastOperator>::Insert
                    ((PrimitiveDictionary<unsigned_short,_int,_duckdb::ParquetCastOperator> *)
                     CONCAT17(bVar7,in_stack_ffffffffffffff70),
                     (unsigned_short)((ulong)this_01 >> 0x30));
          pSVar3->total_value_count = pSVar3->total_value_count + 1;
          iVar6 = DlbaEncoder::GetStringSize<unsigned_short>(puVar4 + (long)local_40);
          pSVar3->total_string_size = iVar6 + pSVar3->total_string_size;
        }
        local_40 = local_40 + 1;
      }
    }
  }
  return;
}

Assistant:

void Analyze(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector, idx_t count) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();

		auto data_ptr = FlatVector::GetData<SRC>(vector);
		idx_t vector_index = 0;

		const bool check_parent_empty = parent && !parent->is_empty.empty();
		const idx_t parent_index = state.definition_levels.size();

		const idx_t vcount =
		    check_parent_empty ? parent->definition_levels.size() - state.definition_levels.size() : count;

		const auto &validity = FlatVector::Validity(vector);

		if (!check_parent_empty && validity.AllValid()) {
			// Fast path
			for (; vector_index < vcount; vector_index++) {
				const auto &src_value = data_ptr[vector_index];
				state.dictionary.Insert(src_value);
				state.total_value_count++;
				state.total_string_size += DlbaEncoder::GetStringSize(src_value);
			}
		} else {
			for (idx_t i = 0; i < vcount; i++) {
				if (check_parent_empty && parent->is_empty[parent_index + i]) {
					continue;
				}
				if (validity.RowIsValid(vector_index)) {
					const auto &src_value = data_ptr[vector_index];
					state.dictionary.Insert(src_value);
					state.total_value_count++;
					state.total_string_size += DlbaEncoder::GetStringSize(src_value);
				}
				vector_index++;
			}
		}
	}